

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O0

void Qiniu_Rio_Recorder_Cleanup(Qiniu_Rio_Recorder *recorder)

{
  Qiniu_Rio_Recorder *recorder_local;
  
  if (recorder != (Qiniu_Rio_Recorder *)0x0) {
    if (recorder->recorderMedium != (Qiniu_Record_Medium *)0x0) {
      (*recorder->recorderMedium->close)(recorder->recorderMedium);
      recorder->recorderMedium = (Qiniu_Record_Medium *)0x0;
    }
    if (recorder->recorderKey != (char *)0x0) {
      Qiniu_FreeV2(&recorder->recorderKey);
    }
  }
  return;
}

Assistant:

static void Qiniu_Rio_Recorder_Cleanup(Qiniu_Rio_Recorder *recorder)
{
    if (recorder != NULL)
    {
        if (recorder->recorderMedium != NULL)
        {
            recorder->recorderMedium->close(recorder->recorderMedium);
            recorder->recorderMedium = NULL;
        }
        if (recorder->recorderKey != NULL)
        {
            Qiniu_FreeV2((void **)&recorder->recorderKey);
        }
    }
}